

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O2

FILE * __thiscall FlatFileSeq::Open(FlatFileSeq *this,FlatFilePos *pos,bool read_only)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *__modes;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  path pStack_78;
  path path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos->nFile == -1) {
    __stream = (FILE *)0x0;
    goto LAB_003b6abc;
  }
  FileName(&path,this,pos);
  std::filesystem::__cxx11::path::parent_path();
  bVar2 = std::filesystem::is_symlink(&pStack_78);
  if (bVar2) {
    bVar2 = std::filesystem::is_directory(&pStack_78);
    if (!bVar2) goto LAB_003b6992;
  }
  else {
LAB_003b6992:
    std::filesystem::create_directories((path *)&pStack_78);
  }
  std::filesystem::__cxx11::path::~path(&pStack_78);
  __modes = "rb+";
  if (read_only) {
    __modes = "rb";
  }
  __stream = fsbridge::fopen((char *)&path,__modes);
  if (__stream == (FILE *)0x0 && !read_only) {
    __stream = fsbridge::fopen((char *)&path,"wb+");
  }
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&pStack_78._M_pathname,&path.super_path);
    logging_function_00._M_str = "Open";
    logging_function_00._M_len = 4;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
    ;
    source_file_00._M_len = 0x5c;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x2c,ALL,Info,(ConstevalFormatString<1U>)0x6cc787,
               &pStack_78._M_pathname);
    std::__cxx11::string::~string((string *)&pStack_78);
LAB_003b6aaf:
    __stream = (FILE *)0x0;
  }
  else if ((ulong)pos->nPos != 0) {
    iVar3 = fseek(__stream,(ulong)pos->nPos,0);
    if (iVar3 != 0) {
      std::filesystem::__cxx11::path::string(&pStack_78._M_pathname,&path.super_path);
      logging_function._M_str = "Open";
      logging_function._M_len = 4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
      ;
      source_file._M_len = 0x5c;
      LogPrintFormatInternal<unsigned_int,std::__cxx11::string>
                (logging_function,source_file,0x30,ALL,Info,(ConstevalFormatString<2U>)0x6cc79f,
                 &pos->nPos,&pStack_78._M_pathname);
      std::__cxx11::string::~string((string *)&pStack_78);
      fclose(__stream);
      goto LAB_003b6aaf;
    }
  }
  std::filesystem::__cxx11::path::~path(&path.super_path);
LAB_003b6abc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (FILE *)__stream;
  }
  __stack_chk_fail();
}

Assistant:

FILE* FlatFileSeq::Open(const FlatFilePos& pos, bool read_only) const
{
    if (pos.IsNull()) {
        return nullptr;
    }
    fs::path path = FileName(pos);
    fs::create_directories(path.parent_path());
    FILE* file = fsbridge::fopen(path, read_only ? "rb": "rb+");
    if (!file && !read_only)
        file = fsbridge::fopen(path, "wb+");
    if (!file) {
        LogPrintf("Unable to open file %s\n", fs::PathToString(path));
        return nullptr;
    }
    if (pos.nPos && fseek(file, pos.nPos, SEEK_SET)) {
        LogPrintf("Unable to seek to position %u of %s\n", pos.nPos, fs::PathToString(path));
        fclose(file);
        return nullptr;
    }
    return file;
}